

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::FlushFinishTests::init(FlushFinishTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  FlushFinishCase *pFVar1;
  
  pFVar1 = (FlushFinishCase *)operator_new(0x98);
  Functional::anon_unknown_0::FlushFinishCase::FlushFinishCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"wait","Wait only",EXPECT_COEF_LESS_THAN,
             0.1,EXPECT_COEF_GREATER_THAN,-1000.0);
  (pFVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FlushFinishCase_01e425b8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FlushFinishCase *)operator_new(0x98);
  Functional::anon_unknown_0::FlushFinishCase::FlushFinishCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"flush","Flush only",EXPECT_COEF_LESS_THAN
             ,0.2,EXPECT_COEF_GREATER_THAN,0.5);
  (pFVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FlushFinishCase_01e426a8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FlushFinishCase *)operator_new(0x98);
  Functional::anon_unknown_0::FlushFinishCase::FlushFinishCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"flush_wait","Wait after flushing",
             EXPECT_COEF_LESS_THAN,0.2,EXPECT_COEF_LESS_THAN,0.1);
  (pFVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FlushFinishCase_01e42700;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FlushFinishCase *)operator_new(0x98);
  Functional::anon_unknown_0::FlushFinishCase::FlushFinishCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"finish","Finish only",
             EXPECT_COEF_GREATER_THAN,0.5,EXPECT_COEF_LESS_THAN,0.1);
  (pFVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FlushFinishCase_01e42758;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FlushFinishCase *)operator_new(0x98);
  Functional::anon_unknown_0::FlushFinishCase::FlushFinishCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"finish_wait","Finish and wait",
             EXPECT_COEF_GREATER_THAN,0.5,EXPECT_COEF_LESS_THAN,0.1);
  (pFVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FlushFinishCase_01e427b0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  return extraout_EAX;
}

Assistant:

void FlushFinishTests::init (void)
{
	addChild(new WaitOnlyCase	(m_context));
	addChild(new FlushOnlyCase	(m_context));
	addChild(new FlushWaitCase	(m_context));
	addChild(new FinishOnlyCase	(m_context));
	addChild(new FinishWaitCase	(m_context));
}